

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O2

void google::protobuf::internal::SerializeMessageNoTable(MessageLite *msg,ArrayOutput *output)

{
  int iVar1;
  undefined1 local_98 [8];
  ArrayOutputStream array_stream;
  CodedOutputStream o;
  
  io::ArrayOutputStream::ArrayOutputStream((ArrayOutputStream *)local_98,output->ptr,0x7fffffff,-1);
  io::CodedOutputStream::CodedOutputStream
            ((CodedOutputStream *)&array_stream.position_,(ZeroCopyOutputStream *)local_98);
  (*msg->_vptr_MessageLite[0xc])(msg,o.impl_._56_8_,&array_stream.position_);
  iVar1 = io::CodedOutputStream::ByteCount((CodedOutputStream *)&array_stream.position_);
  output->ptr = output->ptr + iVar1;
  io::CodedOutputStream::~CodedOutputStream((CodedOutputStream *)&array_stream.position_);
  return;
}

Assistant:

void SerializeMessageNoTable(const MessageLite* msg, ArrayOutput* output) {
  io::ArrayOutputStream array_stream(output->ptr, INT_MAX);
  io::CodedOutputStream o(&array_stream);
  o.SetSerializationDeterministic(output->is_deterministic);
  msg->SerializeWithCachedSizes(&o);
  output->ptr += o.ByteCount();
}